

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O1

void __thiscall JsonNumber_Int64Min_Test::~JsonNumber_Int64Min_Test(JsonNumber_Int64Min_Test *this)

{
  void *in_RAX;
  
  (this->super_JsonNumber).super_Test._vptr_Test = (_func_int **)&PTR__JsonNumber_001c0c60;
  mock_json_callbacks::~mock_json_callbacks
            (&(this->super_JsonNumber).callbacks_.super_mock_json_callbacks);
  testing::Mock::UnregisterCallReaction(in_RAX);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonNumber, Int64Min) {
    PSTORE_ASSERT (int64_min_str == std::to_string (int64_min) &&
                   "The hard-wired signed 64-bit min string seems to be incorrect");
    EXPECT_CALL (callbacks_, int64_value (int64_min)).Times (1);
    json::parser<decltype (proxy_)> p (proxy_);
    p.input (std::string{int64_min_str}).eof ();
    EXPECT_FALSE (p.has_error ());
}